

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O1

void __thiscall KeyData_Constructor_Test::TestBody(KeyData_Constructor_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  KeyData empty_obj;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  AssertHelper local_190;
  internal local_188 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  string local_178;
  KeyData local_158;
  
  cfd::core::KeyData::KeyData(&local_158);
  bVar1 = cfd::core::KeyData::IsValid();
  local_188[0] = (internal)(bVar1 ^ 1);
  local_180.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,local_188,(AssertionResult *)"empty_obj.IsValid()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_keydata.cpp"
               ,0x18,local_178._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if (local_198.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_198.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_198.ptr_ + 8))();
      }
      local_198.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::KeyData::~KeyData(&local_158);
  return;
}

Assistant:

TEST(KeyData, Constructor) {
  KeyData empty_obj;
  EXPECT_FALSE(empty_obj.IsValid());
}